

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KInstPrinter.c
# Opt level: O2

void printRegbitsRange(char *buffer,uint32_t data,char *prefix)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0;
  do {
    if (7 < (int)uVar4) {
      return;
    }
    uVar3 = uVar4;
    if ((data >> (uVar4 & 0x1f) & 1) != 0) {
      iVar1 = 0;
      for (; uVar3 != 7; uVar3 = uVar3 + 1) {
        if ((data >> (uVar3 + 1 & 0x1f) & 1) == 0) goto LAB_002449bf;
        iVar1 = iVar1 + 1;
      }
      uVar3 = 7;
      iVar1 = 7 - uVar4;
LAB_002449bf:
      if (*buffer != '\0') {
        sVar2 = strlen(buffer);
        (buffer + sVar2)[0] = '/';
        (buffer + sVar2)[1] = '\0';
      }
      sVar2 = strlen(buffer);
      sprintf(buffer + sVar2,"%s%d",prefix,(ulong)uVar4);
      if (iVar1 != 0) {
        sVar2 = strlen(buffer);
        sprintf(buffer + sVar2,"-%s%d",prefix,(ulong)(iVar1 + uVar4));
      }
    }
    uVar4 = uVar3 + 1;
  } while( true );
}

Assistant:

static void printRegbitsRange(char* buffer, uint32_t data, const char* prefix)
{
	unsigned int first = 0;
	unsigned int run_length = 0;
	int i;

	for (i = 0; i < 8; ++i) {
		if (data & (1 << i)) {
			first = i;
			run_length = 0;

			while (i < 7 && (data & (1 << (i + 1)))) {
				i++;
				run_length++;
			}

			if (buffer[0] != 0)
				strcat(buffer, "/");

			sprintf(buffer + strlen(buffer), "%s%d", prefix, first);
			if (run_length > 0)
				sprintf(buffer + strlen(buffer), "-%s%d", prefix, first + run_length);
		}
	}
}